

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O1

char * __thiscall CVmImageFileExt_blk::suballoc(CVmImageFileExt_blk *this,size_t siz)

{
  char *pcVar1;
  
  if (this->rem_ < siz) {
    return (char *)0x0;
  }
  pcVar1 = this->free_ptr_;
  this->free_ptr_ = pcVar1 + siz;
  this->rem_ = this->rem_ - siz;
  return pcVar1;
}

Assistant:

char *CVmImageFileExt_blk::suballoc(size_t siz)
{
    char *ret;
    
    /* if we don't have enough memory available, fail the request */
    if (rem_ < siz)
        return 0;

    /* our return value will be the current free pointer */
    ret = free_ptr_;

    /* move the free pointer past the allocated block */
    free_ptr_ += siz;

    /* deduct the amount we just allocated from the space available */
    rem_ -= siz;

    /* return the memory */
    return ret;
}